

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O2

Interval interval::neg(Interval i)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = i.first;
  if ((iVar4 == 0x7fffffff) && (((ulong)i & 0xffffffff00000000) == 0x7fffffff00000000)) {
    uVar3 = 0x80000000;
    uVar2 = 0x80000000;
  }
  else {
    if ((ulong)i >> 0x20 == 0x7fffffff) {
      uVar3 = 0x80000000;
      uVar1 = -iVar4;
    }
    else {
      uVar5 = -i.second;
      uVar1 = -iVar4;
      uVar3 = uVar5;
      if (SBORROW4(uVar1,uVar5) != (int)(uVar1 + i.second) < 0) {
        uVar3 = uVar1;
        uVar1 = uVar5;
      }
    }
    uVar2 = (ulong)uVar1;
  }
  return (Interval)((ulong)uVar3 | uVar2 << 0x20);
}

Assistant:

Interval interval::neg(Interval i) {
  Interval result;
  if (minf == lower(i) && pinf == upper(i)) {
    result = full();
  } else if (pinf == lower(i) && minf == upper(i)) {
    result = empty();
  } else if (minf == lower(i) && minf == upper(i)) {
    result = make(pinf, pinf);
  } else if (pinf == lower(i) && pinf == upper(i)) {
    result = make(minf, minf);
  } else if (pinf == upper(i)) {
    result = make(minf, -(lower(i)));
  } else if (minf == lower(i)) {
    result = make(-(upper(i)), pinf);
  } else {
    result = make(std::min(-(upper(i)),-(lower(i))), 
                  std::max(-(upper(i)),-(lower(i))));
  }
  return result;
}